

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O2

string_t __thiscall
duckdb::ReverseOperator::Operation<duckdb::string_t,duckdb::string_t>
          (ReverseOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  string_t target;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  anon_union_16_2_67f50693_for_value local_98;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78 [16];
  GraphemeIterator local_68 [32];
  GraphemeIterator local_48 [32];
  
  local_80 = input.value._0_8_;
  pcVar5 = local_80;
  if ((uint)this < 0xd) {
    pcVar5 = (char *)((long)&local_88 + 4);
  }
  uVar7 = (ulong)this & 0xffffffff;
  local_88 = this;
  auVar8 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar7);
  local_98.pointer.ptr = (char *)auVar8._8_8_;
  local_98._0_8_ = auVar8._0_8_;
  pcVar6 = local_98.pointer.ptr;
  if (auVar8._0_4_ < 0xd) {
    pcVar6 = local_98.pointer.prefix;
  }
  pcVar3 = pcVar6 + uVar7;
  uVar4 = 0;
  do {
    auVar8._8_8_ = local_78._8_8_;
    auVar8._0_8_ = local_78._0_8_;
    pcVar3 = pcVar3 + -1;
    if (uVar7 == uVar4) {
LAB_007b125f:
      string_t::Finalize((string_t *)&local_98.pointer);
      aVar1.pointer.ptr = local_98.pointer.ptr;
      aVar1._0_8_ = local_98._0_8_;
      return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
    }
    if (pcVar5[uVar4] < '\0') {
      local_78 = auVar8;
      if (uVar4 < uVar7) {
        local_78 = duckdb::Utf8Proc::GraphemeClusters(pcVar5,uVar7);
        GraphemeIterator::begin(local_48);
        GraphemeIterator::end(local_68);
        while( true ) {
          cVar2 = duckdb::GraphemeIterator::GraphemeClusterIterator::operator!=
                            ((GraphemeClusterIterator *)local_48,(GraphemeClusterIterator *)local_68
                            );
          if (cVar2 == '\0') break;
          auVar8 = duckdb::GraphemeIterator::GraphemeClusterIterator::operator*
                             ((GraphemeClusterIterator *)local_48);
          memcpy(pcVar6 + (uVar7 - auVar8._8_8_),pcVar5 + auVar8._0_8_,auVar8._8_8_ - auVar8._0_8_);
          duckdb::GraphemeIterator::GraphemeClusterIterator::operator++
                    ((GraphemeClusterIterator *)local_48);
        }
      }
      goto LAB_007b125f;
    }
    *pcVar3 = pcVar5[uVar4];
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();

		auto target = StringVector::EmptyString(result, input_length);
		auto target_data = target.GetDataWriteable();
		if (!StrReverseASCII(input_data, input_length, target_data)) {
			StrReverseUnicode(input_data, input_length, target_data);
		}
		target.Finalize();
		return target;
	}